

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O3

void __thiscall QLayout::removeWidget(QLayout *this,QWidget *widget)

{
  long *plVar1;
  QWidget *pQVar3;
  int iVar4;
  long lVar2;
  
  if (widget == (QWidget *)0x0) {
    removeWidget();
  }
  else {
    lVar2 = *(long *)this;
    iVar4 = 0;
    while( true ) {
      plVar1 = (long *)(**(code **)(lVar2 + 0xa8))(this,iVar4);
      if (plVar1 == (long *)0x0) break;
      pQVar3 = (QWidget *)(**(code **)(*plVar1 + 0x68))(plVar1);
      if (pQVar3 == widget) {
        plVar1 = (long *)(**(code **)(*(long *)this + 0xb0))(this,iVar4);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 8))(plVar1);
        }
        (**(code **)(*(long *)this + 0x70))(this);
      }
      else {
        iVar4 = iVar4 + 1;
      }
      lVar2 = *(long *)this;
    }
  }
  return;
}

Assistant:

void QLayout::removeWidget(QWidget *widget)
{
    if (Q_UNLIKELY(!widget)) {
        qWarning("QLayout::removeWidget: Cannot remove a null widget.");
        return;
    }

    int i = 0;
    QLayoutItem *child;
    while ((child = itemAt(i))) {
        if (child->widget() == widget) {
            delete takeAt(i);
            invalidate();
        } else {
            ++i;
        }
    }
}